

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

Clump * rw::Clump::create(void)

{
  FILE *__stream;
  char *pcVar1;
  EVP_PKEY_CTX *ctx;
  Error local_20;
  Error _e;
  Clump *clump;
  
  _e = (Error)malloc_LOC((long)(int)s_plglist,0x30010,
                         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/clump.cpp line: 30"
                        );
  if (_e == (Error)0x0) {
    local_20.plugin = 2;
    local_20.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/clump.cpp"
            ,0x20);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&local_20);
    clump = (Clump *)0x0;
  }
  else {
    numAllocated = numAllocated + 1;
    ctx = (EVP_PKEY_CTX *)0x2;
    Object::init((Object *)_e,(EVP_PKEY_CTX *)0x2);
    LinkList::init((LinkList *)((long)_e + 0x10),ctx);
    LinkList::init((LinkList *)((long)_e + 0x20),ctx);
    LinkList::init((LinkList *)((long)_e + 0x30),ctx);
    *(undefined8 *)((long)_e + 0x40) = 0;
    LLLink::init((LLLink *)((long)_e + 0x48),ctx);
    PluginList::construct((PluginList *)&s_plglist,(void *)_e);
    clump = (Clump *)_e;
  }
  return clump;
}

Assistant:

Clump*
Clump::create(void)
{
	Clump *clump = (Clump*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_CLUMP);
	if(clump == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	clump->object.init(Clump::ID, 0);
	clump->atomics.init();
	clump->lights.init();
	clump->cameras.init();

	// World extension
	clump->world = nil;
	clump->inWorld.init();

	s_plglist.construct(clump);
	return clump;
}